

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O3

void __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeTriang>::InitMaterialDataT<std::complex<double>>
          (TPZCompElHDivCollapsed<pzshape::TPZShapeTriang> *this,
          TPZMaterialDataT<std::complex<double>_> *data)

{
  byte bVar1;
  byte bVar2;
  int *piVar3;
  int iVar4;
  TPZCompMesh *pTVar5;
  TPZConnect *pTVar6;
  TPZConnect *pTVar7;
  long lVar8;
  TPZGeoEl *pTVar9;
  int i_1;
  int i;
  ulong uVar10;
  int i_2;
  long lVar11;
  TPZManVector<long,_3> ids;
  TPZManVector<int,_10> sideorient;
  TPZManVector<int,_10> connectorders;
  TPZVec<long> local_f8;
  long local_d8 [3];
  TPZManVector<int,_10> local_c0;
  TPZManVector<int,_10> local_78;
  
  pTVar5 = TPZCompEl::Mesh((TPZCompEl *)this);
  pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                     (&(pTVar5->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                      this->fbottom_c_index);
  pTVar5 = TPZCompEl::Mesh((TPZCompEl *)this);
  pTVar7 = TPZChunkVector<TPZConnect,_10>::operator[]
                     (&(pTVar5->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,this->ftop_c_index
                     );
  bVar1 = (pTVar7->field_2).fCompose.fOrder;
  bVar2 = (pTVar6->field_2).fCompose.fOrder;
  (**(code **)(*(long *)&(this->super_TPZCompElHDiv<pzshape::TPZShapeTriang>).
                         super_TPZIntelGen<pzshape::TPZShapeTriang>.super_TPZInterpolatedElement.
                         super_TPZInterpolationSpace.super_TPZCompEl + 600))(this);
  iVar4 = (**(code **)(*(long *)&(this->super_TPZCompElHDiv<pzshape::TPZShapeTriang>).
                                 super_TPZIntelGen<pzshape::TPZShapeTriang>.
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x90))(this);
  lVar11 = (long)iVar4;
  local_c0.super_TPZVec<int>._vptr_TPZVec._0_4_ = 0;
  TPZManVector<int,_10>::TPZManVector(&local_78,lVar11,(int *)&local_c0);
  uVar10 = 0;
  do {
    lVar8 = (**(code **)(*(long *)&(this->super_TPZCompElHDiv<pzshape::TPZShapeTriang>).
                                   super_TPZIntelGen<pzshape::TPZShapeTriang>.
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,uVar10 & 0xffffffff);
    local_78.super_TPZVec<int>.fStore[uVar10] = (uint)*(byte *)(lVar8 + 0x14);
    uVar10 = uVar10 + 1;
  } while (uVar10 != 4);
  local_78.super_TPZVec<int>.fStore[lVar11 + -2] = (uint)bVar2;
  local_78.super_TPZVec<int>.fStore[lVar11 + -1] = (uint)bVar1;
  local_f8._vptr_TPZVec = (_func_int **)((ulong)local_f8._vptr_TPZVec & 0xffffffff00000000);
  TPZManVector<int,_10>::TPZManVector(&local_c0,5,(int *)&local_f8);
  piVar3 = (this->super_TPZCompElHDiv<pzshape::TPZShapeTriang>).fSideOrient.super_TPZVec<int>.fStore
  ;
  lVar11 = 0;
  do {
    local_c0.super_TPZVec<int>.fStore[lVar11] = piVar3[lVar11];
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  iVar4 = (**(code **)(*(long *)&(this->super_TPZCompElHDiv<pzshape::TPZShapeTriang>).
                                 super_TPZIntelGen<pzshape::TPZShapeTriang>.
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x2f0))(this,6);
  local_c0.super_TPZVec<int>.fStore[3] = iVar4;
  iVar4 = (**(code **)(*(long *)&(this->super_TPZCompElHDiv<pzshape::TPZShapeTriang>).
                                 super_TPZIntelGen<pzshape::TPZShapeTriang>.
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x2f0))(this);
  local_c0.super_TPZVec<int>.fStore[4] = iVar4;
  pTVar9 = TPZCompEl::Reference((TPZCompEl *)this);
  TPZVec<long>::TPZVec(&local_f8,0);
  local_f8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0187b688;
  local_f8.fNElements = 3;
  local_f8.fNAlloc = 0;
  uVar10 = 0;
  local_f8.fStore = local_d8;
  do {
    lVar11 = (**(code **)(*(long *)pTVar9 + 0xa8))(pTVar9,uVar10 & 0xffffffff);
    local_f8.fStore[uVar10] = lVar11;
    uVar10 = uVar10 + 1;
  } while (uVar10 != 3);
  TPZShapeHDivCollapsed<pzshape::TPZShapeTriang>::Initialize
            (&local_f8,&local_78.super_TPZVec<int>,&local_c0.super_TPZVec<int>,(TPZShapeData *)data)
  ;
  if (local_f8.fStore != local_d8) {
    local_f8.fNAlloc = 0;
    local_f8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_f8.fStore != (long *)0x0) {
      operator_delete__(local_f8.fStore);
    }
  }
  TPZManVector<int,_10>::~TPZManVector(&local_c0);
  TPZManVector<int,_10>::~TPZManVector(&local_78);
  return;
}

Assistant:

void TPZCompElHDivCollapsed<TSHAPE>::InitMaterialDataT(TPZMaterialDataT<TVar> &data)
{
    TPZShapeData& shapedata = data;
    
    // Order of top and bot connect
    TPZConnect& connbot = this->Mesh()->ConnectVec()[fbottom_c_index];
    TPZConnect& conntop = this->Mesh()->ConnectVec()[ftop_c_index];
    const int toporder = conntop.Order();
    const int bottomorder = connbot.Order();
    
    // Number of shape and dim
    const int64_t nvecshapecollpased = this->NShapeF();
    const int dim = TSHAPE::Dimension+1;
    
    // Order of connects
    int ncon = NConnects();
    TPZManVector<int> connectorders(ncon,0);
    for(int i=0; i<TSHAPE::NFacets+1; i++) connectorders[i] = this->Connect(i).Order();
    connectorders[ncon-2] = bottomorder;
    connectorders[ncon-1] = toporder;
    
    // Side orient
    TPZManVector<int> sideorient(TSHAPE::NFacets+2,0);
    for(int i=0; i<TSHAPE::NFacets; i++) sideorient[i] = this->SideOrient(i);
    sideorient[TSHAPE::NFacets] = GetSideOrient(TSHAPE::NSides-1);
    sideorient[TSHAPE::NFacets+1] = GetSideOrient(TSHAPE::NSides);
    
    // Node ids of geoel
    TPZGeoEl *gel = this->Reference();
    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes);
    for(int i=0; i<TSHAPE::NCornerNodes; i++) ids[i] = gel->NodeIndex(i);
    
    // Init shape data
    TPZShapeHDivCollapsed<TSHAPE>::Initialize(ids, connectorders, sideorient, shapedata);

#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
        std::stringstream sout;
        sout << "After InitMaterialData\n";
        data.Print(sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
    
}